

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
SetMapIRCCommand::trigger
          (SetMapIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  undefined8 uVar4;
  char *pcVar5;
  size_t sVar6;
  uint uVar7;
  
  pcVar5 = channel._M_str;
  sVar6 = channel._M_len;
  if (parameters._M_len == 0) {
    Jupiter::IRC::Client::sendNotice
              (source,nick._M_len,nick._M_str,0x2f,"Error: Too few parameters. Syntax: setmap <map>"
              );
    return;
  }
  lVar2 = Jupiter::IRC::Client::getChannel(source,sVar6,pcVar5);
  if (lVar2 != 0) {
    Jupiter::IRC::Client::Channel::getType();
    lVar2 = 0;
    uVar7 = 0;
    while( true ) {
      RenX::getCore();
      uVar3 = RenX::Core::getServerCount();
      if (uVar3 == uVar7) break;
      uVar3 = RenX::getCore();
      uVar4 = RenX::Core::getServer(uVar3);
      cVar1 = RenX::Server::isLogChanType((int)uVar4);
      if (cVar1 != '\0') {
        lVar2 = RenX::Server::getMapName(uVar4,parameters._M_len,parameters._M_str);
        if (lVar2 == 0) {
          Jupiter::IRC::Client::sendMessage(source,sVar6,pcVar5,0x1b,"Error: Map not in rotation.");
          lVar2 = 0;
        }
        else {
          cVar1 = RenX::Server::setMap(uVar4,lVar2);
          if (cVar1 == '\0') {
            Jupiter::IRC::Client::sendMessage(source,sVar6,pcVar5,0x1a,"Error: Transmission error.")
            ;
          }
        }
      }
      uVar7 = uVar7 + 1;
    }
    if (lVar2 == 0) {
      Jupiter::IRC::Client::sendMessage
                (source,sVar6,pcVar5,0x40,
                 "Error: Channel not attached to any connected Renegade X servers.");
      return;
    }
  }
  return;
}

Assistant:

void SetMapIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	if (!parameters.empty())
	{
		Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
		if (chan != nullptr)
		{
			std::string_view map_name;
			int type = chan->getType();
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
			{
				RenX::Server *server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type))
				{
					map_name = server->getMapName(parameters);
					if (map_name.empty())
						source->sendMessage(channel, "Error: Map not in rotation."sv);
					else if (server->setMap(map_name) == false)
						source->sendMessage(channel, "Error: Transmission error."sv);
				}
			}
			if (map_name.empty())
				source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		}
	}
	else
		source->sendNotice(nick, "Error: Too few parameters. Syntax: setmap <map>"sv);
}